

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QPointF __thiscall QGraphicsItem::mapToParent(QGraphicsItem *this,QPointF *point)

{
  QGraphicsItemPrivate *this_00;
  long in_FS_OFFSET;
  double dVar1;
  double in_XMM1_Qa;
  QPointF QVar2;
  QTransform QStack_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->transformData == (TransformData *)0x0) {
    dVar1 = (this_00->pos).xp + point->xp;
    in_XMM1_Qa = (this_00->pos).yp + point->yp;
  }
  else {
    QGraphicsItemPrivate::transformToParent(&QStack_68,this_00);
    dVar1 = (double)QTransform::map((QPointF *)&QStack_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar2.yp = in_XMM1_Qa;
    QVar2.xp = dVar1;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsItem::mapToParent(const QPointF &point) const
{
    // COMBINE
    if (!d_ptr->transformData)
        return point + d_ptr->pos;
    return d_ptr->transformToParent().map(point);
}